

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *__nptr;
  char *__nptr_00;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  time_t tVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  ulonglong uVar13;
  size_t *prog;
  size_t *psVar14;
  uint *puVar15;
  unsigned_long_long uVar16;
  long lVar17;
  float fVar18;
  double dVar19;
  char *pcStack_1138;
  size_t *psStack_1130;
  char **ppcStack_1128;
  int *piStack_1120;
  size_t *psStack_1118;
  char *pcStack_1110;
  code *pcStack_1108;
  char *pcStack_1100;
  char **ppcStack_10f8;
  ulong uStack_10f0;
  char *pcStack_10e8;
  size_t *psStack_10e0;
  ulong uStack_10d8;
  code *apcStack_10d0 [2];
  unsigned_long_long local_10c0;
  test_params p;
  ulong local_70;
  unsigned_long_long used_size;
  float local_5c;
  ulong local_58;
  unsigned_long_long local_50;
  void *local_48;
  double local_40;
  char local_31;
  on_evict_info info;
  
  local_40 = 0.0;
  apcStack_10d0[0] = (code *)0x1014c4;
  memset(&p.extent_size,0,0x1018);
  local_10c0 = 0x100000;
  p.pool_size = 0x100;
  p.seconds._4_4_ = 1;
  local_50 = 0x46;
  puVar15 = &switchD_00101522::switchdataD_00102010;
  uVar11 = 0;
  local_48 = (void *)0x0;
LAB_00101501:
  apcStack_10d0[0] = (code *)0x10150f;
  iVar7 = getopt(argc,argv,"hp:e:v:t:m:o:d:s:n");
  switch(iVar7) {
  case 100:
    if (*_optarg != '\0') {
      apcStack_10d0[0] = (code *)0x101543;
      strcpy((char *)&p.val_max,_optarg);
      goto LAB_00101501;
    }
    apcStack_10d0[0] = (code *)0x101a1f;
    argerror("invalid dir argument\n",*argv);
LAB_00101a1f:
    apcStack_10d0[0] = (code *)0x101a2e;
    argerror("missing required dir argument\n",*argv);
    break;
  case 0x65:
    apcStack_10d0[0] = (code *)0x101599;
    p.pool_size = parse_ull("extent size",*argv);
    goto LAB_00101501;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x71:
  case 0x72:
  case 0x75:
switchD_00101522_caseD_66:
    apcStack_10d0[0] = (code *)0x1019f8;
    argerror("",*argv);
switchD_00101522_caseD_68:
    apcStack_10d0[0] = (code *)0x101a09;
    printf("usage: %s -d <dir> [-p <pool_size>] [-e <extent_size>] [-v <val_max_factor>] [-t <timeout_seconds>] [-m <timeout_minutes>] [-o <timeout_hours>] [-s <seed_for_rand>] [-n] [-h]\n\t n  -  do not print out csv output (it is printed by default)\n"
           ,*argv);
    apcStack_10d0[0] = (code *)0x101a10;
    __libc_start_main(0);
  case 0x68:
    goto switchD_00101522_caseD_68;
  case 0x6d:
    apcStack_10d0[0] = (code *)0x10156b;
    uVar8 = parse_unsigned("minutes",*argv);
    uVar11 = (ulong)uVar8;
    goto LAB_00101501;
  case 0x6e:
    p.seconds._4_4_ = 0;
    goto LAB_00101501;
  case 0x6f:
    apcStack_10d0[0] = (code *)0x10157f;
    uVar8 = parse_unsigned("hours",*argv);
    local_48 = (void *)(ulong)uVar8;
    goto LAB_00101501;
  case 0x70:
    apcStack_10d0[0] = (code *)0x1015ce;
    local_10c0 = parse_ull("pool size",*argv);
    goto LAB_00101501;
  case 0x73:
    apcStack_10d0[0] = (code *)0x101554;
    p.seconds._0_4_ = parse_unsigned("seed for rand()",*argv);
    goto LAB_00101501;
  case 0x74:
    apcStack_10d0[0] = (code *)0x1015b4;
    uVar8 = parse_unsigned("seconds",*argv);
    local_40 = (double)(ulong)uVar8;
    goto LAB_00101501;
  case 0x76:
    goto switchD_00101522_caseD_76;
  default:
    if (iVar7 != -1) goto switchD_00101522_caseD_66;
    if ((char)p.val_max == '\0') goto LAB_00101a1f;
    p.dir._4088_8_ = (long)local_48 * 0xe10 + uVar11 * 0x3c + (long)local_40;
    if (p.dir._4088_8_ != 0) {
      p.extent_size = local_50 * p.pool_size;
      puVar15 = (uint *)&p.val_max;
      if ((uint)p.seconds == 0) {
        apcStack_10d0[0] = (code *)0x101662;
        tVar9 = time((time_t *)0x0);
        p.seconds._0_4_ = (uint)tVar9;
      }
      apcStack_10d0[0] = (code *)0x101670;
      srand((uint)p.seconds);
      apcStack_10d0[0] = (code *)0x101684;
      printf("seed = %u\n",(ulong)(uint)p.seconds);
      apcStack_10d0[0] = (code *)0x101689;
      argv = (char **)vmemcache_new();
      apcStack_10d0[0] = (code *)0x10169b;
      vmemcache_set_size(argv,local_10c0);
      apcStack_10d0[0] = (code *)0x1016aa;
      vmemcache_set_extent_size(argv,p.pool_size);
      apcStack_10d0[0] = (code *)0x1016b7;
      vmemcache_set_eviction_policy(argv,1);
      apcStack_10d0[0] = (code *)0x1016c2;
      prog = (size_t *)puVar15;
      iVar7 = vmemcache_add(argv);
      if (iVar7 != 0) goto LAB_00101a3d;
      local_31 = '\0';
      apcStack_10d0[0] = (code *)0x1016e0;
      vmemcache_callback_on_evict(argv,on_evict);
      if (p.seconds._4_4_ != 0) {
        apcStack_10d0[0] = (code *)0x1016f5;
        puts("keynum,ratio");
      }
      sVar4 = p.extent_size;
      apcStack_10d0[0] = (code *)0x101704;
      local_48 = malloc(p.extent_size);
      if (local_48 == (void *)0x0) {
        apcStack_10d0[0] = (code *)0x10198a;
        fprintf(_stderr,"malloc: cannot allocate memory (%zu bytes)\n",sVar4);
        iVar7 = 1;
        goto LAB_00101952;
      }
      apcStack_10d0[0] = (code *)0x101718;
      tVar9 = time((time_t *)0x0);
      uVar16 = tVar9 + p.dir._4088_8_;
      apcStack_10d0[0] = (code *)0x101729;
      tVar9 = time((time_t *)0x0);
      local_50 = uVar16;
      if (tVar9 < (long)uVar16) {
        local_58 = 0;
        lVar6 = 0;
        used_size = (unsigned_long_long)argv;
        goto LAB_0010174c;
      }
      if (p.seconds._4_4_ == 0) goto LAB_0010193a;
      lVar17 = -1;
      dVar19 = 0.0;
      goto LAB_00101927;
    }
  }
  prog = (size_t *)*argv;
  apcStack_10d0[0] = (code *)0x101a3d;
  argerror("timeout must be greater than 0\n",(char *)prog);
LAB_00101a3d:
  apcStack_10d0[0] = parse_ull;
  psVar14 = (size_t *)puVar15;
  main_cold_1();
  __nptr = _optarg;
  pcStack_10e8 = "hp:e:v:t:m:o:d:s:n";
  pcStack_1100 = (char *)0x0;
  pcStack_1108 = (code *)0x101a74;
  ppcStack_10f8 = argv;
  uStack_10f0 = (ulong)(uint)argc;
  psStack_10e0 = (size_t *)puVar15;
  uStack_10d8 = uVar11;
  apcStack_10d0[0] = (code *)&stack0xfffffffffffffff8;
  piVar12 = __errno_location();
  *piVar12 = 0;
  pcStack_1108 = (code *)0x101a8d;
  uVar13 = strtoull(__nptr,&pcStack_1100,10);
  if ((((*piVar12 != 0x22 || uVar13 != 0xffffffffffffffff) && (*piVar12 == 0 || uVar13 != 0)) &&
      (pcStack_1100 != __nptr)) && (*pcStack_1100 == '\0')) {
    return (int)uVar13;
  }
  pcStack_1108 = parse_unsigned;
  parse_ull_cold_1();
  __nptr_00 = _optarg;
  pcStack_1110 = __nptr;
  pcStack_1138 = (char *)0x0;
  psStack_1130 = prog;
  ppcStack_1128 = &pcStack_1100;
  piStack_1120 = piVar12;
  psStack_1118 = psVar14;
  pcStack_1108 = (code *)apcStack_10d0;
  piVar12 = __errno_location();
  *piVar12 = 0;
  uVar11 = strtoul(__nptr_00,&pcStack_1138,10);
  if (((*piVar12 != 0x22 || uVar11 != 0xffffffffffffffff) && (*piVar12 == 0 || uVar11 != 0)) &&
     ((pcStack_1138 != __nptr_00 && (*pcStack_1138 == '\0')))) {
    if (uVar11 >> 0x20 != 0) goto LAB_00101ba0;
    return (int)uVar11;
  }
  fprintf(_stderr,"ERROR: strtoul() failed to convert the string %s",__nptr_00);
  do {
    parse_unsigned_cold_1();
LAB_00101ba0:
    fprintf(_stderr,"ERROR: value %s is bigger than UINT_MAX (%u)",__nptr_00,0xffffffff);
  } while( true );
switchD_00101522_caseD_76:
  apcStack_10d0[0] = (code *)0x1015f8;
  local_50 = parse_ull("val max factor",*argv);
  goto LAB_00101501;
LAB_0010174c:
  do {
    lVar17 = lVar6;
    apcStack_10d0[0] = (code *)0x101760;
    uVar8 = sprintf((char *)&p.seed,"%zu",lVar17);
    sVar5 = p.extent_size;
    sVar4 = p.pool_size;
    if ((int)uVar8 < 0) {
      apcStack_10d0[0] = (code *)0x1019ad;
      fprintf(_stderr,"sprintf return value: %d\n",(ulong)uVar8);
LAB_001019de:
      iVar7 = 1;
      goto LAB_00101949;
    }
    apcStack_10d0[0] = (code *)0x101781;
    iVar7 = rand();
    argv = (char **)used_size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar4;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(auVar3 / auVar1,0);
    apcStack_10d0[0] = (code *)0x1017c8;
    iVar7 = vmemcache_put(used_size,&p.seed,(ulong)uVar8,local_48,
                          ((ulong)(long)iVar7 /
                           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar2,0) + 1U) + 1)
                          * sVar4);
    if (iVar7 != 0) {
      apcStack_10d0[0] = (code *)0x1019b4;
      main_cold_2();
      goto LAB_001019de;
    }
    apcStack_10d0[0] = (code *)0x1017e6;
    iVar7 = vmemcache_get_stat(argv,7,&local_70,8);
    if (iVar7 != 0) {
      apcStack_10d0[0] = (code *)0x1019bb;
      main_cold_3();
      goto LAB_001019de;
    }
    uVar11 = local_10c0;
    if ((long)local_10c0 < 0) {
      uVar11 = local_10c0 >> 1;
    }
    fVar18 = (float)local_70 / (float)local_10c0;
    if (p.seconds._4_4_ != 0) {
      local_40 = (double)CONCAT44(local_40._4_4_,fVar18);
      if (lVar17 != 0) {
        apcStack_10d0[0] = (code *)0x101872;
        uVar10 = lroundf(fVar18 * 100.0);
        apcStack_10d0[0] = (code *)0x101887;
        uVar11 = lroundf(local_5c * 100.0);
        fVar18 = local_40._0_4_;
        if (uVar10 == uVar11) {
          local_58 = 0;
          goto LAB_001018c3;
        }
      }
      local_58 = CONCAT71((int7)(uVar11 >> 8),1);
      apcStack_10d0[0] = (code *)0x1018b9;
      printf("%zu,%.3f\n",(double)fVar18,lVar17);
      local_5c = local_40._0_4_;
      fVar18 = local_40._0_4_;
    }
LAB_001018c3:
    dVar19 = (double)fVar18;
    if ((local_31 == '\x01') && (dVar19 < 0.87)) {
      apcStack_10d0[0] = (code *)0x1019de;
      fprintf(_stderr,"insufficient space utilization. ratio: %.3f: seed %u\n",dVar19,
              (ulong)(uint)p.seconds);
      goto LAB_001019de;
    }
    apcStack_10d0[0] = (code *)0x1018ee;
    local_40 = dVar19;
    tVar9 = time((time_t *)0x0);
    lVar6 = lVar17 + 1;
  } while (tVar9 < (long)local_50);
  if (p.seconds._4_4_ == 0) {
LAB_0010193a:
    apcStack_10d0[0] = (code *)0x101946;
    puts("Passed");
  }
  else {
    iVar7 = 0;
    dVar19 = local_40;
    if ((local_58 & 1) != 0) goto LAB_00101949;
LAB_00101927:
    apcStack_10d0[0] = (code *)0x101938;
    printf("%zu,%.3f\n",dVar19,lVar17);
  }
  iVar7 = 0;
LAB_00101949:
  apcStack_10d0[0] = (code *)0x101952;
  free(local_48);
LAB_00101952:
  apcStack_10d0[0] = (code *)0x10195a;
  vmemcache_delete(argv);
  return iVar7;
}

Assistant:

int
main(int argc, char **argv)
{
	test_params p = parse_args(argc, argv);

	VMEMcache *vc = vmemcache_new();
	vmemcache_set_size(vc, p.pool_size);
	vmemcache_set_extent_size(vc, p.extent_size);
	vmemcache_set_eviction_policy(vc, VMEMCACHE_REPLACEMENT_LRU);
	if (vmemcache_add(vc, p.dir))
		UT_FATAL("vmemcache_new: %s (%s)", vmemcache_errormsg(), p.dir);

	int ret = put_until_timeout(vc, &p);

	vmemcache_delete(vc);

	return ret;
}